

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptBitsChk(poptBits bits,char *s)

{
  uint uVar1;
  size_t local_48;
  uint32_t ix;
  uint32_t h;
  int rc;
  uint32_t h1;
  uint32_t h0;
  size_t ns;
  char *s_local;
  poptBits bits_local;
  
  ns = (size_t)s;
  s_local = (char *)bits;
  if (s == (char *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = strlen(s);
  }
  _h1 = local_48;
  rc = 0;
  h = 0;
  ix = 1;
  if ((s_local == (char *)0x0) || (local_48 == 0)) {
    bits_local._4_4_ = 0xffffffec;
  }
  else {
    poptJlu32lpair((void *)ns,local_48,(uint32_t *)&rc,&h);
    for (_h1 = 0; _h1 < _poptBitsK; _h1 = _h1 + 1) {
      uVar1 = (rc + (int)_h1 * h) % _poptBitsM;
      if ((*(uint *)(s_local + (ulong)(uVar1 >> 5) * 4) & 1 << ((byte)uVar1 & 0x1f)) == 0) {
        ix = 0;
        break;
      }
    }
    bits_local._4_4_ = ix;
  }
  return bits_local._4_4_;
}

Assistant:

int poptBitsChk(poptBits bits, const char * s)
{
    size_t ns = (s ? strlen(s) : 0);
    uint32_t h0 = 0;
    uint32_t h1 = 0;
    int rc = 1;

    if (bits == NULL || ns == 0)
	return POPT_ERROR_NULLARG;

    poptJlu32lpair(s, ns, &h0, &h1);

    for (ns = 0; ns < (size_t)_poptBitsK; ns++) {
        uint32_t h = h0 + ns * h1;
        uint32_t ix = (h % _poptBitsM);
        if (PBM_ISSET(ix, bits))
            continue;
        rc = 0;
        break;
    }
    return rc;
}